

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

void __thiscall
spvutils::
HexFloat<spvutils::FloatProxy<float>,spvutils::HexFloatTraits<spvutils::FloatProxy<float>>>::
castTo<spvutils::HexFloat<spvutils::FloatProxy<spvutils::Float16>,spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>>>>
          (HexFloat<spvutils::FloatProxy<float>,spvutils::HexFloatTraits<spvutils::FloatProxy<float>>>
           *this,HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
                 *other,round_direction round_dir)

{
  HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
  *pHVar1;
  ushort uVar2;
  unsigned_short uVar3;
  uint_type uVar4;
  bool bVar5;
  bool local_7d;
  ushort local_7c;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  FloatProxy<spvutils::Float16> local_40;
  ushort local_3e;
  FloatProxy<spvutils::Float16> local_3c;
  bool local_3a;
  bool round_underflow_up;
  uint uStack_38;
  uint_type shifted_significand;
  bool is_inf;
  int iStack_34;
  bool is_nan;
  uint_type check_bit;
  int_type exponent;
  uint_type rounded_significand;
  FloatProxy<spvutils::Float16> FStack_26;
  bool carried;
  uint_type significand;
  FloatProxy<spvutils::Float16> local_20;
  FloatProxy<spvutils::Float16> local_1e;
  round_direction rStack_1c;
  bool negate;
  HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
  *pHStack_18;
  round_direction round_dir_local;
  HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
  *other_local;
  HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
  *this_local;
  
  rStack_1c = round_dir;
  pHStack_18 = other;
  other_local = (HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
                 *)this;
  FloatProxy<spvutils::Float16>::FloatProxy(&local_20,0);
  HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
  ::HexFloat((HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
              *)&local_1e,local_20);
  (pHStack_18->value_).data_ = local_1e.data_;
  significand._3_1_ =
       HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
       ::isNegative((HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                     *)this);
  uVar4 = HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
          ::getUnsignedBits((HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                             *)this);
  pHVar1 = pHStack_18;
  if (uVar4 == 0) {
    if ((significand._3_1_ & 1) != 0) {
      FStack_26 = HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
                  ::value(pHStack_18);
      significand._0_2_ = FloatProxy<spvutils::Float16>::operator-(&stack0xffffffffffffffda);
      HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
      ::set_value(pHVar1,significand._0_2_);
    }
  }
  else {
    exponent = HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
               ::getSignificandBits
                         ((HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                           *)this);
    check_bit._3_1_ = 0;
    check_bit._0_2_ =
         getRoundedNormalizedSignificand<spvutils::HexFloat<spvutils::FloatProxy<spvutils::Float16>,spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>>>>
                   (this,rStack_1c,(bool *)((long)&check_bit + 3));
    iStack_34 = HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                ::getUnbiasedExponent
                          ((HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                            *)this);
    if (iStack_34 == -0x7f) {
      iStack_34 = -0x7e;
      for (uStack_38 = 0x400000;
          (uStack_38 != 0 && (iStack_34 = iStack_34 + -1, (uStack_38 & exponent) == 0));
          uStack_38 = uStack_38 >> 1) {
      }
    }
    uVar4 = HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
            ::getBits((HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                       *)this);
    bVar5 = (uVar4 & 0x7f800000) == 0x7f800000;
    local_59 = bVar5 && exponent != 0;
    round_underflow_up = local_59;
    local_5a = false;
    if (!bVar5 || exponent == 0) {
      local_5b = true;
      if ((int)(iStack_34 + (uint)(check_bit._3_1_ & 1)) < 0x10) {
        local_5c = false;
        if (exponent == 0) {
          uVar4 = HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                  ::getBits((HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                             *)this);
          local_5c = (uVar4 & 0x7f800000) == 0x7f800000;
        }
        local_5b = local_5c;
      }
      local_5a = local_5b;
    }
    pHVar1 = pHStack_18;
    local_3a = local_5a;
    if (local_5a == false) {
      if ((round_underflow_up & 1U) == 0) {
        bVar5 = HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                ::isNegative((HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                              *)this);
        if (bVar5) {
          local_7d = rStack_1c == kRoundToNegativeInfinity;
        }
        else {
          local_7d = rStack_1c == kRoundToPositiveInfinity;
        }
        HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
        ::setFromSignUnbiasedExponentAndNormalizedSignificand
                  (pHStack_18,(bool)(significand._3_1_ & 1),(int_type)iStack_34,(uint_type)check_bit
                   ,local_7d);
      }
      else {
        uVar4 = HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                ::negatable_left_shift<int>
                          ((HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
                            *)this,-0xd,exponent);
        pHVar1 = pHStack_18;
        local_3e = (ushort)uVar4;
        uVar2 = 0;
        if ((significand._3_1_ & 1) != 0) {
          uVar2 = 0x8000;
        }
        local_7c = local_3e;
        if (local_3e == 0) {
          local_7c = 1;
        }
        uVar3 = BitwiseCast<unsigned_short,unsigned_short>(uVar2 | 0x7c00 | local_7c);
        FloatProxy<spvutils::Float16>::FloatProxy(&local_40,uVar3);
        HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
        ::set_value(pHVar1,local_40);
      }
    }
    else {
      uVar2 = 0;
      if ((significand._3_1_ & 1) != 0) {
        uVar2 = 0x8000;
      }
      uVar3 = BitwiseCast<unsigned_short,unsigned_short>(uVar2 | 0x7c00);
      FloatProxy<spvutils::Float16>::FloatProxy(&local_3c,uVar3);
      HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
      ::set_value(pHVar1,local_3c);
    }
  }
  return;
}

Assistant:

void castTo(other_T& other, round_direction round_dir) {
    other = other_T(static_cast<typename other_T::native_type>(0));
    bool negate = isNegative();
    if (getUnsignedBits() == 0) {
      if (negate) {
        other.set_value(-other.value());
      }
      return;
    }
    uint_type significand = getSignificandBits();
    bool carried = false;
    typename other_T::uint_type rounded_significand =
        getRoundedNormalizedSignificand<other_T>(round_dir, &carried);

    int_type exponent = getUnbiasedExponent();
    if (exponent == min_exponent) {
      // If we are denormal, normalize the exponent, so that we can encode
      // easily.
      exponent = static_cast<int_type>(exponent + 1);
      for (uint_type check_bit = first_exponent_bit >> 1; check_bit != 0;
           check_bit = static_cast<uint_type>(check_bit >> 1)) {
        exponent = static_cast<int_type>(exponent - 1);
        if (check_bit & significand) break;
      }
    }

    bool is_nan =
        (getBits() & exponent_mask) == exponent_mask && significand != 0;
    bool is_inf =
        !is_nan &&
        ((exponent + carried) > static_cast<int_type>(other_T::exponent_bias) ||
         (significand == 0 && (getBits() & exponent_mask) == exponent_mask));

    // If we are Nan or Inf we should pass that through.
    if (is_inf) {
      other.set_value(BitwiseCast<typename other_T::underlying_type>(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask)));
      return;
    }
    if (is_nan) {
      typename other_T::uint_type shifted_significand;
      shifted_significand = static_cast<typename other_T::uint_type>(
          negatable_left_shift(
              static_cast<int_type>(other_T::num_fraction_bits) -
              static_cast<int_type>(num_fraction_bits), significand));

      // We are some sort of Nan. We try to keep the bit-pattern of the Nan
      // as close as possible. If we had to shift off bits so we are 0, then we
      // just set the last bit.
      other.set_value(BitwiseCast<typename other_T::underlying_type>(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask |
              (shifted_significand == 0 ? 0x1 : shifted_significand))));
      return;
    }

    bool round_underflow_up =
        isNegative() ? round_dir == kRoundToNegativeInfinity
                     : round_dir == kRoundToPositiveInfinity;
    typedef typename other_T::int_type other_int_type;
    // setFromSignUnbiasedExponentAndNormalizedSignificand will
    // zero out any underflowing value (but retain the sign).
    other.setFromSignUnbiasedExponentAndNormalizedSignificand(
        negate, static_cast<other_int_type>(exponent), rounded_significand,
        round_underflow_up);
    return;
  }